

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::UnknownFieldParserHelper::ParseLengthDelimited
          (UnknownFieldParserHelper *this,uint32_t num,char *ptr,ParseContext *ctx)

{
  uint32_t size;
  string *s;
  char *pcVar1;
  char *local_20;
  
  local_20 = ptr;
  s = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(this->unknown_,num);
  size = ReadSize(&local_20);
  if (local_20 == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = EpsCopyInputStream::ReadString(&ctx->super_EpsCopyInputStream,local_20,size,s);
  }
  return pcVar1;
}

Assistant:

const char* ParseLengthDelimited(uint32_t num, const char* ptr,
                                   ParseContext* ctx) {
    std::string* s = unknown_->AddLengthDelimited(num);
    int size = ReadSize(&ptr);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    return ctx->ReadString(ptr, size, s);
  }